

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test3::prepareProgram
          (GPUShaderFP64Test3 *this,programInfo *program_info,uniformDataLayout uniform_data_layout)

{
  Context *ctx;
  GPUShaderFP64Test3 *this_00;
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  local_890;
  long *local_878;
  long local_868 [2];
  long *local_858;
  long local_848 [2];
  long *local_838;
  long local_828 [2];
  long *local_818;
  long local_808 [2];
  long *local_7f8;
  long local_7e8 [2];
  stringstream fragment_shader_code;
  undefined1 local_7c8 [376];
  stringstream vertex_shader_code;
  undefined1 local_640 [376];
  stringstream tess_eval_shader_code;
  undefined1 local_4b8 [376];
  stringstream tess_control_shader_code;
  undefined1 local_330 [376];
  stringstream geometry_shader_code;
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&fragment_shader_code);
  std::__cxx11::stringstream::stringstream((stringstream *)&geometry_shader_code);
  std::__cxx11::stringstream::stringstream((stringstream *)&tess_control_shader_code);
  std::__cxx11::stringstream::stringstream((stringstream *)&tess_eval_shader_code);
  std::__cxx11::stringstream::stringstream((stringstream *)&vertex_shader_code);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_7c8,"#version 400 core\n\nprecision highp float;\n\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#version 400 core\n\nprecision highp float;\n\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\n",0x4c)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,"#version 400 core\n\nprecision highp float;\n\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,"layout(vertices = 1) out;\n\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,"#version 400 core\n\nprecision highp float;\n\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,"layout(isolines, point_mode) in;\n\n",0x22);
  this_00 = (GPUShaderFP64Test3 *)local_640;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_640,"#version 400 core\n\nprecision highp float;\n\n",0x2b);
  writeUniformBlock(this_00,(ostream *)local_7c8,uniform_data_layout);
  writeUniformBlock(this_00,(ostream *)local_1a8,uniform_data_layout);
  writeUniformBlock(this_00,(ostream *)local_330,uniform_data_layout);
  writeUniformBlock(this_00,(ostream *)local_4b8,uniform_data_layout);
  writeUniformBlock(this_00,(ostream *)local_640,uniform_data_layout);
  writeVaryingDeclarations(this_00,(ostream *)local_7c8,FRAGMENT_SHADER);
  writeVaryingDeclarations(this_00,(ostream *)local_1a8,GEOMETRY_SHADER);
  writeVaryingDeclarations(this_00,(ostream *)local_330,TESS_CONTROL_SHADER);
  writeVaryingDeclarations(this_00,(ostream *)local_4b8,TESS_EVAL_SHADER);
  writeVaryingDeclarations(this_00,(ostream *)local_640,VERTEX_SHADER);
  writeMainBody(this,(ostream *)local_7c8,FRAGMENT_SHADER);
  writeMainBody(this,(ostream *)local_1a8,GEOMETRY_SHADER);
  writeMainBody(this,(ostream *)local_330,TESS_CONTROL_SHADER);
  writeMainBody(this,(ostream *)local_4b8,TESS_EVAL_SHADER);
  writeMainBody(this,(ostream *)local_640,VERTEX_SHADER);
  ctx = (this->super_TestCase).m_context;
  std::
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  ::vector(&local_890,&this->m_uniform_details);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  programInfo::init(program_info,(EVP_PKEY_CTX *)ctx);
  if (local_878 != local_868) {
    operator_delete(local_878,local_868[0] + 1);
  }
  if (local_858 != local_848) {
    operator_delete(local_858,local_848[0] + 1);
  }
  if (local_838 != local_828) {
    operator_delete(local_838,local_828[0] + 1);
  }
  if (local_818 != local_808) {
    operator_delete(local_818,local_808[0] + 1);
  }
  if (local_7f8 != local_7e8) {
    operator_delete(local_7f8,local_7e8[0] + 1);
  }
  if (local_890.
      super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_890.
                    super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_890.
                          super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_890.
                          super__Vector_base<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&vertex_shader_code);
  std::ios_base::~ios_base((ios_base *)(local_640 + 0x70));
  std::__cxx11::stringstream::~stringstream((stringstream *)&tess_eval_shader_code);
  std::ios_base::~ios_base((ios_base *)(local_4b8 + 0x70));
  std::__cxx11::stringstream::~stringstream((stringstream *)&tess_control_shader_code);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  std::__cxx11::stringstream::~stringstream((stringstream *)&geometry_shader_code);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::stringstream::~stringstream((stringstream *)&fragment_shader_code);
  std::ios_base::~ios_base((ios_base *)(local_7c8 + 0x70));
  return;
}

Assistant:

void GPUShaderFP64Test3::prepareProgram(programInfo& program_info, uniformDataLayout uniform_data_layout) const
{
	/* Storage for shader source code */
	std::stringstream fragment_shader_code;
	std::stringstream geometry_shader_code;
	std::stringstream tess_control_shader_code;
	std::stringstream tess_eval_shader_code;
	std::stringstream vertex_shader_code;

	/* Write preambles */
	writePreamble(fragment_shader_code, FRAGMENT_SHADER);
	writePreamble(geometry_shader_code, GEOMETRY_SHADER);
	writePreamble(tess_control_shader_code, TESS_CONTROL_SHADER);
	writePreamble(tess_eval_shader_code, TESS_EVAL_SHADER);
	writePreamble(vertex_shader_code, VERTEX_SHADER);

	/* Write definition of named uniform block */
	writeUniformBlock(fragment_shader_code, uniform_data_layout);
	writeUniformBlock(geometry_shader_code, uniform_data_layout);
	writeUniformBlock(tess_control_shader_code, uniform_data_layout);
	writeUniformBlock(tess_eval_shader_code, uniform_data_layout);
	writeUniformBlock(vertex_shader_code, uniform_data_layout);

	/* Write definitions of varyings */
	writeVaryingDeclarations(fragment_shader_code, FRAGMENT_SHADER);
	writeVaryingDeclarations(geometry_shader_code, GEOMETRY_SHADER);
	writeVaryingDeclarations(tess_control_shader_code, TESS_CONTROL_SHADER);
	writeVaryingDeclarations(tess_eval_shader_code, TESS_EVAL_SHADER);
	writeVaryingDeclarations(vertex_shader_code, VERTEX_SHADER);

	/* Write main routine */
	writeMainBody(fragment_shader_code, FRAGMENT_SHADER);
	writeMainBody(geometry_shader_code, GEOMETRY_SHADER);
	writeMainBody(tess_control_shader_code, TESS_CONTROL_SHADER);
	writeMainBody(tess_eval_shader_code, TESS_EVAL_SHADER);
	writeMainBody(vertex_shader_code, VERTEX_SHADER);

	/* Init programInfo instance */
	program_info.init(m_context, m_uniform_details, fragment_shader_code.str().c_str(),
					  geometry_shader_code.str().c_str(), tess_control_shader_code.str().c_str(),
					  tess_eval_shader_code.str().c_str(), vertex_shader_code.str().c_str());
}